

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  UOption *pUVar2;
  FILE *pFVar3;
  uint uVar4;
  int extraout_EAX;
  int iVar5;
  int extraout_EAX_00;
  int32_t length;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  EVP_PKEY_CTX *__s;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  UErrorCode *pErrorCode;
  EVP_PKEY_CTX *pEVar14;
  UErrorCode *pErrorCode_00;
  UStringPrepType type;
  int iVar15;
  EVP_PKEY_CTX *pEVar16;
  UErrorCode *pUVar17;
  UErrorCode code;
  char **__endptr;
  UErrorCode errorCode;
  uint32_t uStackY_260;
  uint32_t uStackY_25c;
  ulong uStackY_258;
  char *pcStackY_250;
  uint32_t auStackY_248 [42];
  UErrorCode *pUStackY_1a0;
  char *pcStackY_198;
  char *pcStackY_190;
  char *pcStackY_188;
  EVP_PKEY_CTX *pEStackY_180;
  EVP_PKEY_CTX *pEStackY_178;
  byte bStackY_170;
  byte bStackY_16f;
  byte bStackY_16c;
  byte bStackY_16b;
  char *pcStackY_168;
  uint32_t auStackY_160 [42];
  UErrorCode *pUStackY_b8;
  char *pcStackY_b0;
  EVP_PKEY_CTX *pEStackY_a8;
  EVP_PKEY_CTX *pEStackY_a0;
  UErrorCode local_84;
  char *local_80;
  char *local_78 [9];
  
  local_84 = U_ZERO_ERROR;
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109a7c;
  options[4].value = u_getDataDirectory_63();
  options[5].value = "";
  options[0xb].value = "0";
  options[7].value = "sprep";
  options[8].value = "";
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109aca;
  uVar4 = u_parseArgs(argc,argv,0xc,options);
  pcVar11 = options[7].value;
  pcVar10 = options[5].value;
  if ((int)uVar4 < 0) {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109d64;
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[-uVar4]);
LAB_00109d64:
    iVar15 = printHelp(uVar4,(char **)*argv);
    return iVar15;
  }
  if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') goto LAB_00109d64;
  beVerbose = options[2].doesOccur;
  haveCopyright = options[3].doesOccur;
  pUVar2 = options + 8;
  if (options[8].doesOccur == '\0') {
    pUVar2 = options + 9;
  }
  if ((uVar4 < 2) || (options[0xb].doesOccur == '\0')) goto LAB_00109d64;
  local_80 = options[4].value;
  pcVar1 = pUVar2->value;
  pcVar12 = argv[1];
  if (options[6].doesOccur != '\0') {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109b63;
    u_setDataDirectory_63(options[6].value);
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b6f;
  setUnicodeVersion(options[0xb].value);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b77;
  sVar6 = strlen(pcVar10);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109b82;
  sVar7 = strlen(pcVar12);
  if (pcVar1 == (char *)0x0) {
    sVar8 = 0;
  }
  else {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109b92;
    sVar8 = strlen(pcVar1);
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109ba6;
  __s = (EVP_PKEY_CTX *)uprv_malloc_63(sVar8 + sVar6 + sVar7 + 0x28);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bb6;
  pcVar9 = strchr(pcVar10,0x2f);
  pEVar16 = __s;
  if (pcVar9 == (char *)0x0) {
    *(undefined2 *)__s = 0x2f2e;
    pEVar16 = __s + 2;
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bd0;
  strcpy((char *)pEVar16,pcVar10);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bd8;
  pEVar14 = __s;
  sVar6 = strlen((char *)__s);
  pEVar16 = __s + sVar6;
  if ((0 < (long)sVar6) && (pEVar16[-1] != (EVP_PKEY_CTX)0x2f)) {
    *pEVar16 = (EVP_PKEY_CTX)0x2f;
    pEVar16 = pEVar16 + 1;
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bf3;
  init(pEVar14);
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109bfe;
  strcpy((char *)pEVar16,pcVar12);
  uVar13 = 0;
  pEStackY_a0 = (EVP_PKEY_CTX *)0x109c28;
  u_parseDelimitedFile((char *)__s,';',(char *(*) [2])local_78,3,strprepProfileLineFn,__s,&local_84)
  ;
  pFVar3 = _stderr;
  pErrorCode = (UErrorCode *)
               CONCAT71((int7)((ulong)uVar13 >> 8),
                        local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR);
  if (local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (U_ZERO_ERROR < local_84) {
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d8b;
      pcVar10 = u_errorName_63(local_84);
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109da2;
      fprintf(pFVar3,"Could not open file %s for reading. Error: %s \n",__s,pcVar10);
      return local_84;
    }
    if (options[8].doesOccur == '\0') {
      iVar15 = 0;
LAB_00109cf9:
      iVar5 = iVar15 + 2;
      if (options[10].doesOccur == '\0') {
        iVar5 = iVar15;
      }
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d0b;
      setOptions(iVar5);
      if (local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109d1f;
        generateData(local_80,pcVar11);
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109d24;
        cleanUpData();
      }
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d2c;
      uprv_free_63(__s);
      pEStackY_a0 = (EVP_PKEY_CTX *)0x109d31;
      u_cleanup_63();
      return local_84;
    }
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109c5d;
    strcpy((char *)__s,pcVar1);
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109c65;
    sVar6 = strlen((char *)__s);
    pEVar14 = __s + sVar6;
    if ((0 < (long)sVar6) && (pEVar14[-1] != (EVP_PKEY_CTX)0x2f)) {
      *pEVar14 = (EVP_PKEY_CTX)0x2f;
      pEVar14 = pEVar14 + 1;
    }
    *pEVar14 = (EVP_PKEY_CTX)0x2f;
    *(undefined8 *)(pEVar14 + 1) = 0x7a696c616d726f4e;
    *(undefined8 *)(pEVar14 + 9) = 0x726f436e6f697461;
    *(undefined8 *)(pEVar14 + 0xe) = 0x6974636572726f43;
    *(undefined8 *)(pEVar14 + 0x16) = 0x7478742e736e6f;
    uVar13 = 0;
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109cba;
    u_parseDelimitedFile
              ((char *)__s,';',(char *(*) [2])local_78,4,normalizationCorrectionsLineFn,(void *)0x0,
               &local_84);
    pErrorCode = (UErrorCode *)
                 CONCAT71((int7)((ulong)uVar13 >> 8),
                          local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR);
    if (local_84 == U_FILE_ACCESS_ERROR || local_84 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar15 = 1;
      if (U_ZERO_ERROR < local_84) {
        pEStackY_a0 = (EVP_PKEY_CTX *)0x109cf5;
        fprintf(_stderr,"Could not open file %s for reading \n",__s);
        return local_84;
      }
      goto LAB_00109cf9;
    }
  }
  else {
    pEStackY_a0 = (EVP_PKEY_CTX *)0x109db1;
    main_cold_1();
  }
  pEStackY_a0 = (EVP_PKEY_CTX *)normalizationCorrectionsLineFn;
  pEVar14 = __s;
  main_cold_2();
  pcStackY_b0 = pcVar11;
  pEStackY_178 = (EVP_PKEY_CTX *)0x109de3;
  pErrorCode_00 = pErrorCode;
  pUStackY_b8 = &local_84;
  pEStackY_a8 = __s;
  pEStackY_a0 = pEVar16;
  pcVar10 = (char *)strtoul(*(char **)pEVar14,&pcStackY_168,0x10);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e05;
    pErrorCode_00 = pErrorCode;
    uVar4 = u_parseCodePoints(*(char **)(pEVar14 + 0x10),auStackY_160,0x28,pErrorCode);
    pEVar16 = (EVP_PKEY_CTX *)(ulong)uVar4;
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e13;
    u_versionFromString_63(&bStackY_170,*(char **)(pEVar14 + 0x30));
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e24;
    u_versionFromString_63(&bStackY_16c,"3.2.0");
    pUVar17 = (UErrorCode *)(ulong)(uint)*pErrorCode;
    pcVar11 = pcVar10;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((bStackY_16c < bStackY_170) ||
         ((bStackY_170 == bStackY_16c && (bStackY_16b < bStackY_16f)))) {
        pEStackY_178 = (EVP_PKEY_CTX *)0x109e4a;
        storeMapping((uint32_t)pcVar10,auStackY_160,uVar4,USPREP_MAP,pErrorCode);
      }
      pEStackY_178 = (EVP_PKEY_CTX *)0x109e60;
      setUnicodeVersionNC(&bStackY_170);
      return extraout_EAX;
    }
  }
  else {
    pEStackY_178 = (EVP_PKEY_CTX *)0x109e79;
    pUVar17 = pErrorCode;
    normalizationCorrectionsLineFn_cold_2();
  }
  pEStackY_178 = (EVP_PKEY_CTX *)strprepProfileLineFn;
  pcVar10 = pcVar11;
  normalizationCorrectionsLineFn_cold_1();
  uStackY_25c = 0;
  uStackY_260 = 0;
  pUStackY_1a0 = pErrorCode;
  pcStackY_198 = pcVar1;
  pcStackY_190 = pcVar12;
  pcStackY_188 = pcVar11;
  pEStackY_180 = pEVar14;
  pEStackY_178 = pEVar16;
  pcVar11 = u_skipWhitespace(*(char **)pUVar17);
  if (*pcVar11 == '@') {
    pcVar11 = pcVar11 + 1;
    iVar15 = pUVar17[2] - (int)pcVar11;
    if (8 < iVar15) {
      iVar5 = strncmp(pcVar11,"normalize",9);
      if (iVar5 == 0) {
        options[8].doesOccur = '\x01';
        return 0;
      }
      if ((iVar15 != 9) && (iVar15 = strncmp(pcVar11,"check-bidi",10), iVar15 == 0)) {
        options[10].doesOccur = '\x01';
        return 0;
      }
    }
    strprepProfileLineFn_cold_1();
  }
  pcVar1 = *(char **)(pUVar17 + 4);
  __endptr = *(char ***)(pUVar17 + 8);
  pcVar12 = strstr((char *)__endptr,"UNASSIGNED");
  if (pcVar12 == (char *)0x0) {
    pcVar12 = strstr((char *)__endptr,"PROHIBITED");
    if (pcVar12 != (char *)0x0) {
      u_parseCodePointRange(pcVar11,&uStackY_25c,&uStackY_260,pErrorCode_00);
      if (U_ZERO_ERROR < *pErrorCode_00) {
        strprepProfileLineFn_cold_3();
        return extraout_EAX_03;
      }
      type = USPREP_PROHIBITED;
      goto LAB_00109fa3;
    }
    pcVar12 = strstr((char *)__endptr,"MAP");
    if (pcVar12 == (char *)0x0) {
LAB_0010a09d:
      *pErrorCode_00 = U_INVALID_FORMAT_ERROR;
      code = U_INVALID_FORMAT_ERROR;
      goto LAB_0010a05c;
    }
    __endptr = &pcStackY_250;
    uStackY_258 = strtoul(pcVar11,__endptr,0x10);
    if ((pcStackY_250 <= pcVar11) || (pcStackY_250 != *(char **)(pUVar17 + 2))) {
      strprepProfileLineFn_cold_4();
      goto LAB_0010a09d;
    }
    length = u_parseCodePoints(pcVar1,auStackY_248,0x28,pErrorCode_00);
    storeMapping((uint32_t)uStackY_258,auStackY_248,length,USPREP_MAP,pErrorCode_00);
    iVar15 = extraout_EAX_01;
  }
  else {
    u_parseCodePointRange(pcVar11,&uStackY_25c,&uStackY_260,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      strprepProfileLineFn_cold_2();
      return extraout_EAX_02;
    }
    type = USPREP_UNASSIGNED;
LAB_00109fa3:
    storeRange(uStackY_25c,uStackY_260,type,pErrorCode_00);
    iVar15 = extraout_EAX_00;
  }
  code = *pErrorCode_00;
  if (code < U_ILLEGAL_ARGUMENT_ERROR) {
    return iVar15;
  }
  __endptr = *(char ***)(pUVar17 + 8);
LAB_0010a05c:
  pFVar3 = _stderr;
  uVar13 = *(undefined8 *)pUVar17;
  pcVar11 = u_errorName_63(code);
  fprintf(pFVar3,"gensprep error parsing  %s line %s at %s. Error: %s\n",pcVar10,uVar13,__endptr,
          pcVar11);
  exit(*pErrorCode_00);
}

Assistant:

extern int
main(int argc, char* argv[]) {
#if !UCONFIG_NO_IDNA
    char* filename = NULL;
#endif
    const char *srcDir=NULL, *destDir=NULL, *icuUniDataDir=NULL;
    const char *bundleName=NULL, *inputFileName = NULL;
    char *basename=NULL;
    int32_t sprepOptions = 0;

    UErrorCode errorCode=U_ZERO_ERROR;

    U_MAIN_INIT_ARGS(argc, argv);

    /* preset then read command line options */
    options[DESTDIR].value=u_getDataDirectory();
    options[SOURCEDIR].value="";
    options[UNICODE_VERSION].value="0"; /* don't assume the unicode version */
    options[BUNDLE_NAME].value = DATA_NAME;
    options[NORMALIZE].value = "";

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if(argc<0 || options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        return printHelp(argc, argv);
        
    }

    /* get the options values */
    beVerbose=options[VERBOSE].doesOccur;
    haveCopyright=options[COPYRIGHT].doesOccur;
    srcDir=options[SOURCEDIR].value;
    destDir=options[DESTDIR].value;
    bundleName = options[BUNDLE_NAME].value;
    if(options[NORMALIZE].doesOccur) {
        icuUniDataDir = options[NORMALIZE].value;
    } else {
        icuUniDataDir = options[NORM_CORRECTION_DIR].value;
    }

    if(argc<2) {
        /* print the help message */
        return printHelp(argc, argv);
    } else {
        inputFileName = argv[1];
    }
    if(!options[UNICODE_VERSION].doesOccur){
        return printHelp(argc, argv);
    }
    if(options[ICUDATADIR].doesOccur) {
        u_setDataDirectory(options[ICUDATADIR].value);
    }
#if UCONFIG_NO_IDNA

    fprintf(stderr,
        "gensprep writes dummy " U_ICUDATA_NAME "_" DATA_NAME "." DATA_TYPE
        " because UCONFIG_NO_IDNA is set, \n"
        "see icu/source/common/unicode/uconfig.h\n");
    generateData(destDir, bundleName);

#else

    setUnicodeVersion(options[UNICODE_VERSION].value);
    filename = (char* ) uprv_malloc(uprv_strlen(srcDir) + uprv_strlen(inputFileName) + (icuUniDataDir == NULL ? 0 : uprv_strlen(icuUniDataDir)) + 40); /* hopefully this should be enough */
   
    /* prepare the filename beginning with the source dir */
    if(uprv_strchr(srcDir,U_FILE_SEP_CHAR) == NULL && uprv_strchr(srcDir,U_FILE_ALT_SEP_CHAR) == NULL){
        filename[0] = '.';
        filename[1] = U_FILE_SEP_CHAR;
        uprv_strcpy(filename+2,srcDir);
    }else{
        uprv_strcpy(filename, srcDir);
    }
    
    basename=filename+uprv_strlen(filename);
    if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
        *basename++=U_FILE_SEP_CHAR;
    }
    
    /* initialize */
    init();

    /* process the file */
    uprv_strcpy(basename,inputFileName);
    parseMappings(filename,FALSE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "Could not open file %s for reading. Error: %s \n", filename, u_errorName(errorCode));
        return errorCode;
    }
    
    if(options[NORMALIZE].doesOccur){ /* this option might be set by @normalize;; in the source file */
        /* set up directory for NormalizationCorrections.txt */
        uprv_strcpy(filename,icuUniDataDir);
        basename=filename+uprv_strlen(filename);
        if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
            *basename++=U_FILE_SEP_CHAR;
        }

        *basename++=U_FILE_SEP_CHAR;
        uprv_strcpy(basename,NORM_CORRECTIONS_FILE_NAME);
    
        parseNormalizationCorrections(filename,&errorCode);
        if(U_FAILURE(errorCode)){
            fprintf(stderr,"Could not open file %s for reading \n", filename);
            return errorCode;
        }
        sprepOptions |= _SPREP_NORMALIZATION_ON;
    }
    
    if(options[CHECK_BIDI].doesOccur){ /* this option might be set by @check-bidi;; in the source file */
        sprepOptions |= _SPREP_CHECK_BIDI_ON;
    }

    setOptions(sprepOptions);

    /* process parsed data */
    if(U_SUCCESS(errorCode)) {
        /* write the data file */
        generateData(destDir, bundleName);

        cleanUpData();
    }

    uprv_free(filename);

    u_cleanup();

#endif

    return errorCode;
}